

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O2

void __thiscall
Catch::Generators::FixedValuesGenerator<std::tuple<int,_int,_int>_>::FixedValuesGenerator
          (FixedValuesGenerator<std::tuple<int,_int,_int>_> *this,
          initializer_list<std::tuple<int,_int,_int>_> values)

{
  allocator_type local_11;
  
  (this->super_IGenerator<std::tuple<int,_int,_int>_>).super_GeneratorUntypedBase.m_stringReprCache.
  _M_dataplus._M_p =
       (pointer)&(this->super_IGenerator<std::tuple<int,_int,_int>_>).super_GeneratorUntypedBase.
                 m_stringReprCache.field_2;
  (this->super_IGenerator<std::tuple<int,_int,_int>_>).super_GeneratorUntypedBase.m_stringReprCache.
  _M_string_length = 0;
  (this->super_IGenerator<std::tuple<int,_int,_int>_>).super_GeneratorUntypedBase.m_stringReprCache.
  field_2._M_local_buf[0] = '\0';
  (this->super_IGenerator<std::tuple<int,_int,_int>_>).super_GeneratorUntypedBase.
  m_currentElementIndex = 0;
  (this->super_IGenerator<std::tuple<int,_int,_int>_>).super_GeneratorUntypedBase.
  _vptr_GeneratorUntypedBase = (_func_int **)&PTR_next_003cfd08;
  std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::vector
            (&this->m_values,values,&local_11);
  this->m_idx = 0;
  return;
}

Assistant:

FixedValuesGenerator( std::initializer_list<T> values ) : m_values( values ) {}